

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O2

void move_to_central_cache(ThreadCache *tc,uint sizeClass)

{
  init_pthread_destructor();
  tc->counter = 0xffffU >> ((byte)(sizeClass >> 2) & 0x1f) & 0xff;
  if (tc->tempList != (FreeBlock *)0x0) {
    spinlock_acquire(&centralCache[sizeClass].lock);
    add_batch_to_central_cache(centralCache + sizeClass,sizeClass,tc->tempList);
    centralCache[sizeClass].lock = 0;
  }
  tc->tempList = tc->freeList;
  tc->freeList = (FreeBlock *)0x0;
  return;
}

Assistant:

static LTALLOC_NOINLINE void move_to_central_cache(ThreadCache* tc, unsigned int sizeClass)
{
	init_pthread_destructor();//needed for cases when freed memory was allocated in the other thread and no alloc was called in this thread till its termination

	tc->counter = batch_size(sizeClass);
	if (tc->tempList)//move temp list to the central cache
	{
		CentralCache* cc = &centralCache[sizeClass];
		SPINLOCK_ACQUIRE(&cc->lock);
		add_batch_to_central_cache(cc, sizeClass, tc->tempList);
		SPINLOCK_RELEASE(&cc->lock);
	}
	// 	else if (unlikely(!tc->freeList))//this is a first call (i.e. when counter = 0) - just initialization of counter needed
	// 	{
	// 		tc->counter--;
	// 		return;
	// 	}

	tc->tempList = tc->freeList;
	tc->freeList = NULL;
}